

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void __thiscall
boost::asio::detail::object_pool<boost::asio::detail::epoll_reactor::descriptor_state>::free
          (object_pool<boost::asio::detail::epoll_reactor::descriptor_state> *this,void *__ptr)

{
  descriptor_state *pdVar1;
  descriptor_state **ppdVar2;
  
  if (this->live_list_ == (descriptor_state *)__ptr) {
    ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)__ptr);
    this->live_list_ = *ppdVar2;
  }
  ppdVar2 = object_pool_access::prev<boost::asio::detail::epoll_reactor::descriptor_state>
                      ((descriptor_state *)__ptr);
  if (*ppdVar2 != (descriptor_state *)0x0) {
    ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)__ptr);
    pdVar1 = *ppdVar2;
    ppdVar2 = object_pool_access::prev<boost::asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)__ptr);
    ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                        (*ppdVar2);
    *ppdVar2 = pdVar1;
  }
  ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                      ((descriptor_state *)__ptr);
  if (*ppdVar2 != (descriptor_state *)0x0) {
    ppdVar2 = object_pool_access::prev<boost::asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)__ptr);
    pdVar1 = *ppdVar2;
    ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                        ((descriptor_state *)__ptr);
    ppdVar2 = object_pool_access::prev<boost::asio::detail::epoll_reactor::descriptor_state>
                        (*ppdVar2);
    *ppdVar2 = pdVar1;
  }
  pdVar1 = this->free_list_;
  ppdVar2 = object_pool_access::next<boost::asio::detail::epoll_reactor::descriptor_state>
                      ((descriptor_state *)__ptr);
  *ppdVar2 = pdVar1;
  ppdVar2 = object_pool_access::prev<boost::asio::detail::epoll_reactor::descriptor_state>
                      ((descriptor_state *)__ptr);
  *ppdVar2 = (descriptor_state *)0x0;
  this->free_list_ = (descriptor_state *)__ptr;
  return;
}

Assistant:

void free(Object* o)
  {
    if (live_list_ == o)
      live_list_ = object_pool_access::next(o);

    if (object_pool_access::prev(o))
    {
      object_pool_access::next(object_pool_access::prev(o))
        = object_pool_access::next(o);
    }

    if (object_pool_access::next(o))
    {
      object_pool_access::prev(object_pool_access::next(o))
        = object_pool_access::prev(o);
    }

    object_pool_access::next(o) = free_list_;
    object_pool_access::prev(o) = 0;
    free_list_ = o;
  }